

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::enumeratePhysicalDevices
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  Context *pCVar1;
  qpTestResult qVar2;
  InstanceInterface *vk;
  VkInstance instance;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  size_type __dnew;
  ResultCollector results;
  string local_290;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  string local_250;
  string local_230;
  TestStatus *local_210;
  Context *local_208;
  ResultCollector local_200;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  qpKeyValueTag local_150;
  deInt64 local_148;
  ios_base local_138 [264];
  
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)context->m_testCtx->m_log;
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
  tcu::ResultCollector::ResultCollector
            (&local_200,(TestLog *)&log->_M_allocated_capacity,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  vk = Context::getInstanceInterface(context);
  instance = Context::getInstance(context);
  ::vk::enumeratePhysicalDevices(&local_270,vk,instance);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"NumDevices","");
  local_258 = log;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  local_208 = context;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Number of devices","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_1b0,&local_290,&local_250,&local_230,QP_KEY_TAG_NONE,
             (long)local_270.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_270.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  tcu::TestLog::writeInteger
            ((TestLog *)&local_258->_M_allocated_capacity,(char *)local_1b0._0_8_,local_190._M_p,
             local_170._M_p,local_150,local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p != &local_160) {
    operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    this = (ostringstream *)(local_1b0 + 8);
    uVar6 = 0;
    local_210 = __return_storage_ptr__;
    do {
      local_1b0._0_8_ = local_258;
      std::__cxx11::ostringstream::ostringstream(this);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
      std::ostream::_M_insert<void_const*>(this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      __return_storage_ptr__ = local_210;
      uVar6 = uVar6 + 1;
      uVar5 = (long)local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
    } while (uVar6 < uVar5);
    local_250._M_string_length = 0;
    local_250._M_dataplus._M_p = (pointer)&PTR__CheckIncompleteResult_00cef850;
    if (local_270.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_270.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::vector
                ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
                 &local_290,uVar5,(allocator_type *)local_1b0);
      pCVar1 = local_208;
      uVar5 = uVar5 / 3;
      if (local_290._M_dataplus._M_p < local_290._M_string_length) {
        pcVar3 = local_290._M_dataplus._M_p + 8;
        if (local_290._M_dataplus._M_p + 8 < local_290._M_string_length) {
          pcVar3 = (char *)local_290._M_string_length;
        }
        memset(local_290._M_dataplus._M_p,0xde,
               ((ulong)(pcVar3 + ~(ulong)local_290._M_dataplus._M_p) & 0xfffffffffffffff8) + 8);
      }
      local_250._M_string_length = uVar5 & 0xffffffff;
      (**(code **)(local_250._M_dataplus._M_p + 0x10))(&local_250,pCVar1,local_290._M_dataplus._M_p)
      ;
      if (((int)local_250._M_string_length == (int)uVar5) && (local_250._M_string_length._4_4_ == 5)
         ) {
        for (pcVar3 = local_290._M_dataplus._M_p + (uVar5 & 0xffffffff) * 8;
            pcVar3 < local_290._M_string_length; pcVar3 = pcVar3 + 8) {
          lVar4 = 0;
          do {
            if (pcVar3[lVar4] != -0x22) goto LAB_004142d6;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 8);
        }
      }
      else {
LAB_004142d6:
        local_230._M_dataplus._M_p = (pointer)0x21;
        local_1b0._0_8_ = &local_1a0;
        local_1b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_230);
        local_1a0._M_allocated_capacity = (size_type)local_230._M_dataplus._M_p;
        *(undefined8 *)(local_1b0._0_8_ + 0x10) = 0x495f4b56206e7275;
        *(undefined8 *)(local_1b0._0_8_ + 0x18) = 0x54454c504d4f434e;
        *(undefined8 *)local_1b0._0_8_ = 0x6964207972657551;
        *(undefined8 *)(local_1b0._0_8_ + 8) = 0x7465722074276e64;
        *(char *)(local_1b0._0_8_ + 0x20) = 'E';
        local_1b0._8_8_ = local_230._M_dataplus._M_p;
        local_230._M_dataplus._M_p[local_1b0._0_8_] = '\0';
        tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._0_8_ != &local_1a0) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_290._M_dataplus._M_p,
                        local_290.field_2._M_allocated_capacity - (long)local_290._M_dataplus._M_p);
      }
    }
  }
  qVar2 = tcu::ResultCollector::getResult(&local_200);
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,local_200.m_message._M_dataplus._M_p,
             local_200.m_message._M_dataplus._M_p + local_200.m_message._M_string_length);
  __return_storage_ptr__->m_code = qVar2;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
             (char *)(local_1b0._0_8_ + local_1b0._8_8_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
  }
  if (local_270.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_270.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus enumeratePhysicalDevices (Context& context)
{
	TestLog&						log		= context.getTestContext().getLog();
	tcu::ResultCollector			results	(log);
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(context.getInstanceInterface(), context.getInstance());

	log << TestLog::Integer("NumDevices", "Number of devices", "", QP_KEY_TAG_NONE, deInt64(devices.size()));

	for (size_t ndx = 0; ndx < devices.size(); ndx++)
		log << TestLog::Message << ndx << ": " << devices[ndx] << TestLog::EndMessage;

	CheckEnumeratePhysicalDevicesIncompleteResult()(context, results, devices.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}